

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainFrame.c
# Opt level: O1

void Abc_FrameReplaceCurrentNetwork(Abc_Frame_t *p,Abc_Ntk_t *pNtk)

{
  int iVar1;
  Abc_Ntk_t *pNtk_00;
  
  if (pNtk == (Abc_Ntk_t *)0x0) {
    return;
  }
  if (pNtk->vPos->nSize == 0) {
    Abc_Print((int)p,(char *)pNtk);
  }
  if ((p->pNtkCur == (Abc_Ntk_t *)0x0) || (iVar1 = Abc_FrameIsFlagEnabled("backup"), iVar1 == 0)) {
    pNtk->pNetBackup = (Abc_Ntk_t *)0x0;
    iVar1 = p->nSteps + 1;
    p->nSteps = iVar1;
    pNtk->iStep = iVar1;
    pNtk_00 = p->pNtkCur;
    if (pNtk_00 == (Abc_Ntk_t *)0x0) goto LAB_0034b9ba;
  }
  else {
    pNtk_00 = p->pNtkCur;
    pNtk->pNetBackup = pNtk_00->pNetBackup;
    pNtk->iStep = pNtk_00->iStep;
  }
  Abc_NtkDelete(pNtk_00);
LAB_0034b9ba:
  p->pNtkCur = pNtk;
  return;
}

Assistant:

void Abc_FrameReplaceCurrentNetwork( Abc_Frame_t * p, Abc_Ntk_t * pNtk )
{
    if ( pNtk == NULL )
        return;

    if ( Abc_NtkPoNum(pNtk) == 0 )
        Abc_Print( 0, "The current network has no primary outputs. Some commands may not work correctly.\n" );

    // transfer the parameters to the new network
    if ( p->pNtkCur && Abc_FrameIsFlagEnabled( "backup" ) )
    {
        Abc_NtkSetBackup( pNtk, Abc_NtkBackup(p->pNtkCur) );
        Abc_NtkSetStep( pNtk, Abc_NtkStep(p->pNtkCur) );
        // delete the current network
        Abc_NtkDelete( p->pNtkCur );
    }
    else
    {
        Abc_NtkSetBackup( pNtk, NULL );
        Abc_NtkSetStep( pNtk, ++p->nSteps );
        // delete the current network if present but backup is disabled
        if ( p->pNtkCur )
            Abc_NtkDelete( p->pNtkCur );
    }
    // set the new current network
    p->pNtkCur = pNtk;
}